

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O1

FunctionBody * __thiscall
TTD::ScriptContextTTD::ResolveParentBody(ScriptContextTTD *this,FunctionBody *body)

{
  Type piVar1;
  Type pSVar2;
  uint uVar3;
  FunctionBody *pFVar4;
  Type this_00;
  uint uVar5;
  
  piVar1 = (this->m_ttdFunctionBodyParentMap).buckets;
  uVar3 = 0;
  if (piVar1 != (Type)0x0) {
    uVar3 = JsUtil::
            BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((uint)((ulong)body >> 3) | 1,(this->m_ttdFunctionBodyParentMap).bucketCount,
                        (this->m_ttdFunctionBodyParentMap).modFunctionIndex);
    uVar5 = piVar1[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar5) {
      pSVar2 = (this->m_ttdFunctionBodyParentMap).entries;
      uVar3 = 0;
      do {
        if (pSVar2[uVar5].
            super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
            super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>_>
            .super_KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>.key == body) {
          this_00 = (this->m_ttdFunctionBodyParentMap).stats;
          goto LAB_009056a1;
        }
        uVar3 = uVar3 + 1;
        uVar5 = pSVar2[uVar5].
                super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
                super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>_>
                .super_KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>.next;
      } while (-1 < (int)uVar5);
    }
  }
  this_00 = (this->m_ttdFunctionBodyParentMap).stats;
  uVar5 = 0xffffffff;
LAB_009056a1:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  if ((int)uVar5 < 0) {
    pFVar4 = (FunctionBody *)0x0;
  }
  else {
    pFVar4 = (this->m_ttdFunctionBodyParentMap).entries[uVar5].
             super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
             super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>_>
             .super_KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>.value;
  }
  return pFVar4;
}

Assistant:

Js::FunctionBody* ScriptContextTTD::ResolveParentBody(Js::FunctionBody* body) const
    {
        //Want to return null if this has no parent (or this is an internal function and we don't care about parents)
        return this->m_ttdFunctionBodyParentMap.LookupWithKey(body, nullptr);
    }